

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isAllowedInClocking(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != LetDeclaration) && (kind != PropertyDeclaration)) && (kind != SequenceDeclaration))
  {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SyntaxFacts::isAllowedInClocking(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::PropertyDeclaration:
        case SyntaxKind::SequenceDeclaration:
        case SyntaxKind::LetDeclaration:
            return true;
        default:
            return false;
    }
}